

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void clearSelect(sqlite3 *db,Select *p,int bFree)

{
  Select *pSVar1;
  bool bVar2;
  
  if (p != (Select *)0x0) {
    bVar2 = bFree == 0;
    do {
      pSVar1 = p->pPrior;
      if (p->pEList != (ExprList *)0x0) {
        exprListDeleteNN(db,p->pEList);
      }
      sqlite3SrcListDelete(db,p->pSrc);
      if (p->pWhere != (Expr *)0x0) {
        sqlite3ExprDeleteNN(db,p->pWhere);
      }
      if (p->pGroupBy != (ExprList *)0x0) {
        exprListDeleteNN(db,p->pGroupBy);
      }
      if (p->pHaving != (Expr *)0x0) {
        sqlite3ExprDeleteNN(db,p->pHaving);
      }
      if (p->pOrderBy != (ExprList *)0x0) {
        exprListDeleteNN(db,p->pOrderBy);
      }
      if (p->pLimit != (Expr *)0x0) {
        sqlite3ExprDeleteNN(db,p->pLimit);
      }
      if (p->pOffset != (Expr *)0x0) {
        sqlite3ExprDeleteNN(db,p->pOffset);
      }
      if (p->pWith != (With *)0x0) {
        sqlite3WithDelete(db,p->pWith);
      }
      if (!bVar2) {
        sqlite3DbFreeNN(db,p);
      }
      bVar2 = false;
      p = pSVar1;
    } while (pSVar1 != (Select *)0x0);
  }
  return;
}

Assistant:

static void clearSelect(sqlite3 *db, Select *p, int bFree){
  while( p ){
    Select *pPrior = p->pPrior;
    sqlite3ExprListDelete(db, p->pEList);
    sqlite3SrcListDelete(db, p->pSrc);
    sqlite3ExprDelete(db, p->pWhere);
    sqlite3ExprListDelete(db, p->pGroupBy);
    sqlite3ExprDelete(db, p->pHaving);
    sqlite3ExprListDelete(db, p->pOrderBy);
    sqlite3ExprDelete(db, p->pLimit);
    sqlite3ExprDelete(db, p->pOffset);
    if( p->pWith ) sqlite3WithDelete(db, p->pWith);
    if( bFree ) sqlite3DbFreeNN(db, p);
    p = pPrior;
    bFree = 1;
  }
}